

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O1

int main(void)

{
  shared_ptr<Liby::TcpServer> echo_server;
  EventLoopGroup group;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  undefined1 local_f8 [48];
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  EventLoopGroup local_a8;
  
  local_118._M_unused._M_object = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"EPOLL","");
  Liby::EventLoopGroup::EventLoopGroup(&local_a8,4,(string *)&local_118);
  if ((code **)local_118._M_unused._0_8_ != &local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  local_118._M_unused._M_object = &local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"localhost","");
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"9377","");
  Liby::EventLoopGroup::creatTcpServer
            ((EventLoopGroup *)local_f8,(string *)&local_a8,(string *)&local_118);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if ((code **)local_118._M_unused._0_8_ != &local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo.cpp:6:25)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/echo.cpp:6:25)>
              ::_M_manager;
  std::function<void_(Liby::Connection_&)>::operator=
            ((function<void_(Liby::Connection_&)> *)(local_f8._0_8_ + 0x98),
             (function<void_(Liby::Connection_&)> *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,3);
  }
  local_f8._16_8_ = 0;
  local_f8._24_8_ = (_Manager_type)0x0;
  local_f8._40_8_ =
       std::
       _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
       ::_M_invoke;
  local_f8._32_8_ =
       std::
       _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
       ::_M_manager;
  Liby::EventLoopGroup::run(&local_a8,(BoolFunctor *)(local_f8 + 0x10));
  if ((_Invoker_type)local_f8._32_8_ != (_Invoker_type)0x0) {
    (*(code *)local_f8._32_8_)
              ((_Any_data *)(local_f8 + 0x10),(_Any_data *)(local_f8 + 0x10),__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  Liby::EventLoopGroup::~EventLoopGroup(&local_a8);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group(4, "EPOLL");
    auto echo_server = group.creatTcpServer("localhost", "9377");
    echo_server->onRead([](Connection &conn) { conn.send(conn.read()); });
    group.run();
    return 0;
}